

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int AF_AActor_RoughMonsterSearch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *pAVar5;
  char *pcVar6;
  bool bVar7;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_0041d560;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041d550:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041d560:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x77a,
                  "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_0041d492;
    pPVar4 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar7 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar7) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041d560;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_0041d550;
LAB_0041d492:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_0041d588:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x77b,
                  "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_0041d588;
  }
  pVVar1 = param + 1;
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_0041d5cf;
    }
    bVar7 = param[2].field_0.i != 0;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_0041d5cf:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x77c,
                    "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar7 = param[2].field_0.i != 0;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_0041d508;
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0041d5ee;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_0041d508:
    pAVar5 = P_RoughMonsterSearch(pAVar5,(pVVar1->field_0).i,bVar7,param[3].field_0.i != 0);
    if (numret < 1) {
      iVar3 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                      ,0x77e,
                      "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar3 = 1;
      VMReturn::SetPointer(ret,pAVar5,1);
    }
    return iVar3;
  }
  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0041d5ee:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x77d,
                "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, RoughMonsterSearch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(distance);
	PARAM_BOOL_DEF(onlyseekable);
	PARAM_BOOL_DEF(frontonly);
	ACTION_RETURN_OBJECT(P_RoughMonsterSearch(self, distance, onlyseekable, frontonly));
}